

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Vec_Int_t * Gla_ManRefinement2(Gla_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  sat_solver2 *psVar4;
  Gia_Man_t *pGVar5;
  int *piVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Vec_Int_t *vCos;
  int *piVar13;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  Vec_Int_t *vRoAnds;
  Vec_Int_t *pVVar14;
  Abc_Cex_t *pAVar15;
  long lVar16;
  Gia_Obj_t *pGVar17;
  char *__function;
  int iVar18;
  uint uVar19;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  char *__file;
  uint uVar24;
  Gla_Man_t *pGVar25;
  Vec_Int_t *pVVar26;
  char *__assertion;
  ulong uVar27;
  long local_80;
  
  Gla_ManRefinement2::Sign = Gla_ManRefinement2::Sign + 1;
  vCos = (Vec_Int_t *)malloc(0x10);
  vCos->nCap = 1000;
  vCos->nSize = 0;
  piVar13 = (int *)malloc(4000);
  vCos->pArray = piVar13;
  vPis = (Vec_Int_t *)malloc(0x10);
  vPis->nCap = 1000;
  vPis->nSize = 0;
  piVar13 = (int *)malloc(4000);
  vPis->pArray = piVar13;
  vPPis = (Vec_Int_t *)malloc(0x10);
  vPPis->nCap = 1000;
  vPPis->nSize = 0;
  piVar13 = (int *)malloc(4000);
  vPPis->pArray = piVar13;
  vRoAnds = (Vec_Int_t *)malloc(0x10);
  vRoAnds->nCap = 1000;
  vRoAnds->nSize = 0;
  piVar13 = (int *)malloc(4000);
  vRoAnds->pArray = piVar13;
  Gla_ManCollect(p,vPis,vPPis,vCos,vRoAnds);
  uVar10 = p->pPars->iFrame;
  if (-1 < (int)uVar10) {
    local_80 = 0;
    uVar20 = extraout_RDX;
    do {
      if (p->pGia->nObjs < 1) {
LAB_00589db2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pVVar26 = p->pvRefis;
      iVar22 = (int)(local_80 + 1);
      Vec_IntFillExtra(pVVar26,iVar22,(int)uVar20);
      if (pVVar26->nSize <= local_80) goto LAB_00589de8;
      pVVar26->pArray[local_80] = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
      iVar18 = vPis->nSize;
      iVar12 = (int)local_80;
      uVar20 = extraout_RDX_00;
      if (0 < (long)iVar18) {
        piVar13 = vPis->pArray;
        lVar16 = 0;
        do {
          lVar21 = (long)piVar13[lVar16];
          if ((lVar21 < 0) || (p->pGia->nObjs <= piVar13[lVar16])) goto LAB_00589dd1;
          pGVar1 = p->pGia->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          pVVar14 = p->pvRefis;
          pVVar26 = pVVar14 + lVar21;
          Vec_IntFillExtra(pVVar26,iVar22,(int)uVar20);
          if (pVVar14[lVar21].nSize <= local_80) goto LAB_00589de8;
          pGVar1 = pGVar1 + lVar21;
          piVar2 = pVVar26->pArray;
          piVar2[local_80] = 0;
          pGVar3 = p->pGia->pObjs;
          if ((pGVar1 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar1)) goto LAB_00589db2;
          iVar8 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
          iVar9 = Gla_ManCheckVar(p,p->pObj2Obj[iVar8],iVar12);
          if (iVar9 == 0) {
            uVar10 = 0;
          }
          else {
            psVar4 = p->pSat;
            uVar10 = Gla_ManGetVar(p,p->pObj2Obj[iVar8],iVar12);
            if (((int)uVar10 < 0) || (psVar4->size <= (int)uVar10)) goto LAB_00589e07;
            uVar10 = (uint)(psVar4->model[uVar10] == 1);
          }
          uVar24 = piVar2[local_80];
          uVar10 = uVar24 & 0x80000006 | uVar10;
          uVar20 = (ulong)uVar10;
          piVar2[local_80] = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13 | uVar10;
          if ((uVar24 & 2) != 0) {
            __assert_fail("pRef->fVisit == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x24b,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          lVar16 = lVar16 + 1;
        } while (iVar18 != lVar16);
      }
      uVar10 = vPPis->nSize;
      if (vPPis->nSize < 1) {
        uVar10 = 0;
      }
      uVar24 = 8;
      uVar27 = 0;
      while (uVar10 != uVar27) {
        lVar16 = (long)vPPis->pArray[uVar27];
        if ((lVar16 < 0) || (pGVar5 = p->pGia, pGVar5->nObjs <= vPPis->pArray[uVar27]))
        goto LAB_00589dd1;
        if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = pGVar5->pObjs + lVar16;
        uVar11 = (uint)*(undefined8 *)pGVar1;
        iVar18 = (int)CONCAT71((int7)((ulong)(lVar16 * 3) >> 8),-1 < (int)uVar11);
        if ((-1 >= (int)uVar11 || (~uVar11 & 0x1fffffff) == 0) &&
           (((uVar11 & 0x9fffffff) != 0x9fffffff ||
            (iVar18 = pGVar5->vCis->nSize - pGVar5->nRegs,
            (int)((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) < iVar18)))) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x251,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        pVVar14 = p->pvRefis;
        pVVar26 = pVVar14 + lVar16;
        Vec_IntFillExtra(pVVar26,iVar22,iVar18);
        if (pVVar14[lVar16].nSize <= local_80) goto LAB_00589de8;
        piVar13 = pVVar26->pArray;
        piVar13[local_80] = 0;
        pGVar3 = p->pGia->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar1)) goto LAB_00589db2;
        iVar18 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
        iVar8 = Gla_ManCheckVar(p,p->pObj2Obj[iVar18],iVar12);
        if (iVar8 == 0) {
          uVar11 = 0;
        }
        else {
          psVar4 = p->pSat;
          uVar11 = Gla_ManGetVar(p,p->pObj2Obj[iVar18],iVar12);
          if (((int)uVar11 < 0) || (psVar4->size <= (int)uVar11)) goto LAB_00589e07;
          uVar11 = (uint)(psVar4->model[uVar11] == 1);
        }
        uVar23 = piVar13[local_80];
        uVar19 = uVar23 & 0x80000002;
        uVar20 = (ulong)uVar19;
        uVar27 = uVar27 + 1;
        piVar13[local_80] =
             (Gla_ManRefinement2::Sign & 0xfffU) * 0x80000 + (uVar24 & 0x7fff8 | uVar11 | uVar19) +
             4;
        uVar24 = uVar24 + 8;
        if ((uVar23 & 2) != 0) {
          __assert_fail("pRef->fVisit == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,599,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
      }
      if (0 < vRoAnds->nSize) {
        lVar16 = 0;
        do {
          lVar21 = (long)vRoAnds->pArray[lVar16];
          if ((lVar21 < 0) || (pGVar5 = p->pGia, pGVar5->nObjs <= vRoAnds->pArray[lVar16]))
          goto LAB_00589dd1;
          if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar5->pObjs + lVar21;
          uVar10 = (uint)*(undefined8 *)pGVar1;
          iVar18 = (int)CONCAT71((int7)((ulong)(lVar21 * 3) >> 8),-1 < (int)uVar10);
          if ((-1 >= (int)uVar10 || (~uVar10 & 0x1fffffff) == 0) &&
             (((uVar10 & 0x9fffffff) != 0x9fffffff ||
              (iVar18 = pGVar5->vCis->nSize - pGVar5->nRegs,
              (int)((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) < iVar18)))) {
            __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x25c,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          pVVar14 = p->pvRefis;
          pVVar26 = pVVar14 + lVar21;
          Vec_IntFillExtra(pVVar26,iVar22,iVar18);
          if (pVVar14[lVar21].nSize <= local_80) goto LAB_00589de8;
          piVar13 = pVVar26->pArray;
          piVar13[local_80] = 0;
          pGVar5 = p->pGia;
          uVar10 = (uint)*(undefined8 *)pGVar1;
          if ((uVar10 & 0x9fffffff) == 0x9fffffff) {
            uVar24 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff;
            iVar18 = pGVar5->vCis->nSize;
            if ((int)uVar24 < iVar18 - pGVar5->nRegs) goto LAB_005894b4;
            if (local_80 == 0) {
              uVar10 = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
            }
            else {
              iVar8 = pGVar5->vCos->nSize;
              uVar24 = (iVar8 - iVar18) + uVar24;
              if (((int)uVar24 < 0) || (iVar8 <= (int)uVar24)) goto LAB_00589eff;
              iVar18 = pGVar5->vCos->pArray[uVar24];
              lVar21 = (long)iVar18;
              if ((lVar21 < 0) || (pGVar5->nObjs <= iVar18)) goto LAB_00589dd1;
              pVVar14 = p->pvRefis;
              pVVar26 = pVVar14 + lVar21;
              Vec_IntFillExtra(pVVar26,iVar12,uVar24);
              if (pVVar14[lVar21].nSize < local_80) goto LAB_00589de8;
              piVar2 = pVVar26->pArray;
              uVar24 = piVar2[local_80 + -1] & 1;
              uVar10 = piVar13[local_80];
              piVar13[local_80] = uVar10 & 0xfffffffe | uVar24;
              uVar10 = (Gla_ManRefinement2::Sign & 0xfffU) << 0x13 |
                       uVar10 & 0x80000006 | uVar24 | piVar2[local_80 + -1] & 0x7fff8U;
            }
          }
          else {
LAB_005894b4:
            if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x26f,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
            }
            pGVar17 = pGVar1 + -(ulong)(uVar10 & 0x1fffffff);
            pGVar3 = pGVar5->pObjs;
            if ((pGVar17 < pGVar3) || (pGVar3 + pGVar5->nObjs <= pGVar17)) goto LAB_00589db2;
            pVVar14 = p->pvRefis;
            iVar18 = (int)((ulong)((long)pGVar17 - (long)pGVar3) >> 2) * -0x55555555;
            pVVar26 = pVVar14 + iVar18;
            Vec_IntFillExtra(pVVar26,iVar22,(int)pGVar3);
            if (pVVar14[iVar18].nSize <= local_80) goto LAB_00589de8;
            pGVar17 = pGVar1 + -(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
            pGVar3 = p->pGia->pObjs;
            if ((pGVar17 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar17)) goto LAB_00589db2;
            piVar2 = pVVar26->pArray;
            pVVar14 = p->pvRefis;
            iVar18 = (int)((ulong)((long)pGVar17 - (long)pGVar3) >> 2) * -0x55555555;
            pVVar26 = pVVar14 + iVar18;
            Vec_IntFillExtra(pVVar26,iVar22,(int)(pGVar3 + p->pGia->nObjs));
            if (pVVar14[iVar18].nSize <= local_80) goto LAB_00589de8;
            piVar6 = pVVar26->pArray;
            piVar13[local_80] =
                 piVar13[local_80] & 0xfffffffeU |
                 ((uint)(*(ulong *)pGVar1 >> 0x3d) ^ piVar6[local_80]) &
                 ((uint)(*(ulong *)pGVar1 >> 0x1d) & 7 ^ piVar2[local_80]) & 1;
            pGVar3 = p->pGia->pObjs;
            if ((pGVar1 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar1)) goto LAB_00589db2;
            if ((p->pObj2Obj[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555] !=
                 0xffffffff) &&
               (iVar18 = Gla_ManCheckVar(p,p->pObj2Obj
                                           [(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) *
                                            -0x55555555],iVar12), iVar18 != 0)) {
              pGVar3 = p->pGia->pObjs;
              if ((pGVar1 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar1)) goto LAB_00589db2;
              uVar10 = piVar13[local_80];
              iVar18 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
              pGVar25 = p;
              iVar8 = Gla_ManCheckVar(p,p->pObj2Obj[iVar18],iVar12);
              iVar9 = (int)pGVar25;
              if (iVar8 == 0) {
                uVar24 = 0;
              }
              else {
                psVar4 = p->pSat;
                pGVar25 = p;
                uVar24 = Gla_ManGetVar(p,p->pObj2Obj[iVar18],iVar12);
                iVar9 = (int)pGVar25;
                if (((int)uVar24 < 0) || (psVar4->size <= (int)uVar24)) {
LAB_00589e07:
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                                ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
                }
                uVar24 = (uint)(psVar4->model[uVar24] == 1);
              }
              if ((uVar10 & 1) != uVar24) {
                Abc_Print(iVar9,"Object has value mismatch    ");
                Gia_ObjPrint(p->pGia,pGVar1);
              }
            }
            uVar10 = piVar13[local_80];
            uVar24 = piVar2[local_80];
            if ((uVar10 & 1) == 0) {
              uVar11 = piVar6[local_80];
              if ((((uint)(*(ulong *)pGVar1 >> 0x1d) & 7 ^ uVar24) & 1) == 0) {
                if ((((uint)(*(ulong *)pGVar1 >> 0x3d) ^ uVar11) & 1) == 0) {
                  uVar23 = uVar24 >> 3 & 0xffff;
                  uVar24 = uVar11 >> 3 & 0xffff;
                  if (uVar23 < uVar24) {
                    uVar24 = uVar23;
                  }
                  uVar24 = uVar24 << 3;
                  uVar11 = 0xfff80006;
                }
                else {
                  uVar24 = uVar24 & 0x7fff8;
                  uVar11 = 0xfff80006;
                }
              }
              else {
                uVar24 = uVar11 & 0x7fff8;
                uVar11 = 0xfff80006;
              }
            }
            else {
              uVar11 = uVar24 >> 3 & 0xffff;
              uVar24 = (uint)piVar6[local_80] >> 3 & 0xffff;
              if (uVar24 < uVar11) {
                uVar24 = uVar11;
              }
              uVar24 = uVar24 << 3;
              uVar11 = 0xfff80007;
            }
            piVar13[local_80] = uVar11 & uVar10 | uVar24;
            if ((uVar10 & 2) != 0) {
              __assert_fail("pRef->fVisit == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x284,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
            }
            uVar10 = uVar11 & uVar10 & 0x8007fffd | uVar24 |
                     (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
          }
          uVar20 = (ulong)uVar10;
          piVar13[local_80] = uVar10;
          lVar16 = lVar16 + 1;
        } while (lVar16 < vRoAnds->nSize);
      }
      iVar18 = vCos->nSize;
      if (0 < (long)iVar18) {
        piVar13 = vCos->pArray;
        lVar16 = 0;
        do {
          lVar21 = (long)piVar13[lVar16];
          if ((lVar21 < 0) || (p->pGia->nObjs <= piVar13[lVar16])) goto LAB_00589dd1;
          pGVar1 = p->pGia->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          pVVar14 = p->pvRefis;
          pVVar26 = pVVar14 + lVar21;
          Vec_IntFillExtra(pVVar26,iVar22,(int)uVar20);
          if (pVVar14[lVar21].nSize <= local_80) goto LAB_00589de8;
          pGVar1 = pGVar1 + lVar21;
          piVar2 = pVVar26->pArray;
          piVar2[local_80] = 0;
          pGVar3 = pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
          pGVar17 = p->pGia->pObjs;
          if ((pGVar3 < pGVar17) || (pGVar17 + p->pGia->nObjs <= pGVar3)) goto LAB_00589db2;
          pVVar14 = p->pvRefis;
          iVar12 = (int)((ulong)((long)pGVar3 - (long)pGVar17) >> 2) * -0x55555555;
          pVVar26 = pVVar14 + iVar12;
          Vec_IntFillExtra(pVVar26,iVar22,(int)(pGVar17 + p->pGia->nObjs));
          if (pVVar14[iVar12].nSize <= local_80) goto LAB_00589de8;
          piVar6 = pVVar26->pArray;
          uVar10 = piVar2[local_80];
          uVar11 = (*(uint *)pGVar1 >> 0x1d ^ piVar6[local_80]) & 1;
          piVar2[local_80] = uVar10 & 0xfffffffe | uVar11;
          uVar20 = 0x7fff8;
          uVar24 = piVar6[local_80] & 0x7fff8;
          piVar2[local_80] = uVar10 & 0xfff80006 | uVar11 | uVar24;
          if ((uVar10 & 2) != 0) {
            __assert_fail("pRef->fVisit == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x28e,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
          }
          piVar2[local_80] =
               uVar10 & 0x80000004 | uVar11 | uVar24 | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13;
          lVar16 = lVar16 + 1;
        } while (iVar18 != lVar16);
      }
      uVar10 = p->pPars->iFrame;
      bVar7 = local_80 < (int)uVar10;
      local_80 = local_80 + 1;
    } while (bVar7);
  }
  pGVar5 = p->pGia;
  iVar22 = pGVar5->vCos->nSize;
  if (iVar22 <= pGVar5->nRegs) {
LAB_00589f1e:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar22 < 1) {
LAB_00589eff:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar18 = *pGVar5->vCos->pArray;
  if ((-1 < (long)iVar18) && (iVar18 < pGVar5->nObjs)) {
    pVVar14 = p->pvRefis + iVar18;
    pVVar26 = pVVar14;
    Vec_IntFillExtra(pVVar14,uVar10 + 1,iVar22);
    if (((int)uVar10 < 0) || (pVVar14->nSize <= (int)uVar10)) {
LAB_00589de8:
      __assertion = "i >= 0 && i < p->nSize";
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
      ;
      __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
      goto LAB_00589dfd;
    }
    piVar13 = pVVar14->pArray;
    uVar24 = piVar13[uVar10];
    if ((uVar24 & 1) == 0) {
      Abc_Print((int)pVVar26,"\nCounter-example verification has failed!!!\n");
      uVar24 = piVar13[uVar10];
    }
    if ((uVar24 & 0x7fff8) == 0) {
      pAVar15 = Gla_ManDeriveCex(p,vPis);
      p->pGia->pCexSeq = pAVar15;
      if (vPis->pArray != (int *)0x0) {
        free(vPis->pArray);
      }
      free(vPis);
      if (vPPis->pArray != (int *)0x0) {
        free(vPPis->pArray);
      }
      free(vPPis);
      if (vRoAnds->pArray != (int *)0x0) {
        free(vRoAnds->pArray);
      }
      free(vRoAnds);
      if (vCos->pArray != (int *)0x0) {
        free(vCos->pArray);
      }
      free(vCos);
      return (Vec_Int_t *)0x0;
    }
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    pVVar14->nCap = 100;
    pVVar14->nSize = 0;
    piVar13 = (int *)malloc(400);
    pVVar14->pArray = piVar13;
    pVVar26 = p->vObjCounts;
    iVar22 = p->pPars->iFrame;
    uVar20 = (long)iVar22 + 1;
    if (pVVar26->nCap <= iVar22) {
      if (pVVar26->pArray == (int *)0x0) {
        piVar13 = (int *)malloc(uVar20 * 4);
      }
      else {
        piVar13 = (int *)realloc(pVVar26->pArray,uVar20 * 4);
      }
      pVVar26->pArray = piVar13;
      if (piVar13 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar26->nCap = (int)uVar20;
    }
    if (-1 < iVar22) {
      memset(pVVar26->pArray,0,(uVar20 & 0xffffffff) << 2);
    }
    pVVar26->nSize = (int)uVar20;
    pGVar5 = p->pGia;
    iVar22 = pGVar5->vCos->nSize;
    if (iVar22 <= pGVar5->nRegs) goto LAB_00589f1e;
    if (iVar22 < 1) goto LAB_00589eff;
    iVar22 = *pGVar5->vCos->pArray;
    if ((-1 < (long)iVar22) && (iVar22 < pGVar5->nObjs)) {
      Gla_ManRefSelect_rec
                (p,pGVar5->pObjs + iVar22 +
                   -(ulong)((uint)*(undefined8 *)(pGVar5->pObjs + iVar22) & 0x1fffffff),
                 p->pPars->iFrame,pVVar14,Gla_ManRefinement2::Sign);
      if (1 < (long)pVVar14->nSize) {
        qsort(pVVar14->pArray,(long)pVVar14->nSize,4,Vec_IntSortCompare1);
        iVar22 = pVVar14->nSize;
        iVar18 = 1;
        if (1 < iVar22) {
          piVar13 = pVVar14->pArray;
          lVar16 = 1;
          do {
            if (piVar13[lVar16] != piVar13[lVar16 + -1]) {
              lVar21 = (long)iVar18;
              iVar18 = iVar18 + 1;
              piVar13[lVar21] = piVar13[lVar16];
              iVar22 = pVVar14->nSize;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < iVar22);
        }
        pVVar14->nSize = iVar18;
      }
      Gla_ManVerifyUsingTerSim(p,vPis,vPPis,vRoAnds,vCos,pVVar14);
      if (0 < pVVar14->nSize) {
        pGVar5 = p->pGia;
        piVar13 = pVVar14->pArray;
        lVar16 = 0;
        do {
          iVar22 = piVar13[lVar16];
          if (((long)iVar22 < 0) || (pGVar5->nObjs <= iVar22)) goto LAB_00589dd1;
          if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
          piVar13[lVar16] = p->pObj2Obj[iVar22];
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar14->nSize);
      }
      if (vPis->pArray != (int *)0x0) {
        free(vPis->pArray);
      }
      free(vPis);
      if (vPPis->pArray != (int *)0x0) {
        free(vPPis->pArray);
      }
      free(vPPis);
      if (vRoAnds->pArray != (int *)0x0) {
        free(vRoAnds->pArray);
      }
      free(vRoAnds);
      if (vCos->pArray != (int *)0x0) {
        free(vCos->pArray);
      }
      free(vCos);
      p->nObjAdded = p->nObjAdded + pVVar14->nSize;
      return pVVar14;
    }
  }
LAB_00589dd1:
  __assertion = "v >= 0 && v < p->nObjs";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h";
  __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
LAB_00589dfd:
  __assert_fail(__assertion,__file,0x1af,__function);
}

Assistant:

Vec_Int_t * Gla_ManRefinement2( Gla_Man_t * p )
{
    int fVerify = 1;
    static int Sign = 0;
    Vec_Int_t * vPis, * vPPis, * vCos, * vRoAnds, * vSelect = NULL;
    Rfn_Obj_t * pRef, * pRef0, * pRef1;
    Gia_Obj_t * pObj;
    int i, f;
    Sign++;

    // compute PIs and pseudo-PIs
    vCos = Vec_IntAlloc( 1000 );
    vPis = Vec_IntAlloc( 1000 );  
    vPPis = Vec_IntAlloc( 1000 );
    vRoAnds = Vec_IntAlloc( 1000 );  
    Gla_ManCollect( p, vPis, vPPis, vCos, vRoAnds );

/*
    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPis, p, pGla, i )
    {
        Abc_Print( 1, "  %5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    

    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPPis, p, pGla, i )
    {
        Abc_Print( 1, "%5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    
*/
    // propagate values
    for ( f = 0; f <= p->pPars->iFrame; f++ )
    {
        // constant
        pRef = Gla_ObjRef( p, Gia_ManConst0(p->pGia), f );  Gla_ObjClearRef( pRef );
        pRef->Value  = 0;
        pRef->Prio   = 0;
        pRef->Sign   = Sign;
        // primary input
        Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = 0;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // primary input
        Gia_ManForEachObjVec( vPPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = i+1;
            pRef->fPPi  = 1;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // internal nodes
        Gia_ManForEachObjVec( vRoAnds, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                {
                    pRef->Value = 0;
                    pRef->Prio  = 0;
                    pRef->Sign  = Sign;
                }
                else
                {
                    pRef0 = Gla_ObjRef( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                    pRef->Value = pRef0->Value;
                    pRef->Prio  = pRef0->Prio;
                    pRef->Sign  = Sign;
                }
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
            pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj)) & (pRef1->Value ^ Gia_ObjFaninC1(pObj));

            if ( p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] != ~0 && 
                 Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) &&
                 (int)pRef->Value != Gla_ObjSatValue(p, Gia_ObjId(p->pGia, pObj), f) )
            {
                    Abc_Print( 1, "Object has value mismatch    " );
                    Gia_ObjPrint( p->pGia, pObj );
            }

            if ( pRef->Value == 1 )
                pRef->Prio  = Abc_MaxInt( pRef0->Prio, pRef1->Prio );
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRef->Prio  = Abc_MinInt( pRef0->Prio, pRef1->Prio ); // choice
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRef->Prio  = pRef0->Prio;
            else 
                pRef->Prio  = pRef1->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
        // output nodes
        Gia_ManForEachObjVec( vCos, p->pGia, pObj, i )
        {
            pRef = Gla_ObjRef( p, pObj, f );    Gla_ObjClearRef( pRef );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f ); 
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj));
            pRef->Prio  = pRef0->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
    } 

    // make sure the output value is 1
    pObj = Gia_ManPo( p->pGia, 0 );
    pRef = Gla_ObjRef( p, pObj, p->pPars->iFrame );
    if ( pRef->Value != 1 )
        Abc_Print( 1, "\nCounter-example verification has failed!!!\n" );

    // check the CEX
    if ( pRef->Prio == 0 )
    {
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vPis );
        Vec_IntFree( vPis );
        Vec_IntFree( vPPis );
        Vec_IntFree( vRoAnds );
        Vec_IntFree( vCos );
        return NULL;
    }

    // select objects
    vSelect = Vec_IntAlloc( 100 );
    Vec_IntFill( p->vObjCounts, p->pPars->iFrame+1, 0 );
    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), p->pPars->iFrame, vSelect, Sign );
    Vec_IntUniqify( vSelect );

/*
    for ( f = 0; f < p->pPars->iFrame; f++ )
        printf( "%2d", Vec_IntEntry(p->vObjCounts, f) );
    printf( "\n" );
*/
    if ( fVerify )
        Gla_ManVerifyUsingTerSim( p, vPis, vPPis, vRoAnds, vCos, vSelect );

    // remap them into GLA objects
    Gia_ManForEachObjVec( vSelect, p->pGia, pObj, i )
        Vec_IntWriteEntry( vSelect, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vRoAnds );
    Vec_IntFree( vCos );

    p->nObjAdded += Vec_IntSize(vSelect);
    return vSelect;
}